

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall
kj::Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>::
Maybe(Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
      *this,Maybe<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
            *other)

{
  kj::_::
  NullableValue<kj::_::Tuple<kj::Maybe<capnp::Orphan<capnp::compiler::LocatedInteger>_>,_bool,_bool>_>
  ::NullableValue(&this->ptr,&other->ptr);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }